

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O1

void __thiscall leveldb::MemEnvTest_Misc_Test::~MemEnvTest_Misc_Test(MemEnvTest_Misc_Test *this)

{
  Env *pEVar1;
  
  (this->super_MemEnvTest).super_Test._vptr_Test = (_func_int **)&PTR__MemEnvTest_0017d1a8;
  pEVar1 = (this->super_MemEnvTest).env_;
  if (pEVar1 != (Env *)0x0) {
    (*pEVar1->_vptr_Env[1])();
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MemEnvTest, Misc) {
  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  ASSERT_TRUE(!test_dir.empty());

  WritableFile* writable_file;
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/a/b", &writable_file));

  // These are no-ops, but we test they return success.
  ASSERT_LEVELDB_OK(writable_file->Sync());
  ASSERT_LEVELDB_OK(writable_file->Flush());
  ASSERT_LEVELDB_OK(writable_file->Close());
  delete writable_file;
}